

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

void std::
     __introsort_loop<sjtu::vector<sjtu::recordType>::iterator,long,__gnu_cxx::__ops::_Iter_comp_iter<sjtu::cmp_cost>>
               (recordType *param_1,vector<sjtu::recordType> *param_2,recordType *param_3,
               vector<sjtu::recordType> *param_4,long __depth_limit)

{
  undefined4 uVar1;
  ulong uVar2;
  recordType *prVar3;
  vector<sjtu::recordType> *pvVar4;
  long lVar5;
  iterator __last;
  iterator __first;
  iterator __first_00;
  iterator __last_00;
  iterator __result;
  recordType *local_40;
  vector<sjtu::recordType> *pvStack_38;
  
  __last.vec = param_4;
  __last.pos = param_3;
  uVar2 = (long)param_3 - (long)param_1;
  if (0x900 < (long)uVar2) {
    __depth_limit = __depth_limit + -1;
    do {
      pvVar4 = __last.vec;
      prVar3 = __last.pos;
      if (__depth_limit == -1) {
        __first.vec = param_2;
        __first.pos = param_1;
        __make_heap<sjtu::vector<sjtu::recordType>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<sjtu::cmp_cost>>
                  (__first,__last,(_Iter_comp_iter<sjtu::cmp_cost> *)&local_40);
        lVar5 = (long)prVar3 - (long)param_1;
        do {
          prVar3 = prVar3 + -1;
          __first_00.vec = param_2;
          __first_00.pos = param_1;
          __last_00.vec = pvVar4;
          __last_00.pos = prVar3;
          __result.vec = pvVar4;
          __result.pos = prVar3;
          __pop_heap<sjtu::vector<sjtu::recordType>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<sjtu::cmp_cost>>
                    (__first_00,__last_00,__result,(_Iter_comp_iter<sjtu::cmp_cost> *)&local_40);
          lVar5 = lVar5 + -0x90;
        } while (0x90 < lVar5);
        return;
      }
      local_40 = prVar3 + -1;
      pvStack_38._0_4_ = __last.vec._0_4_;
      uVar1 = pvStack_38._0_4_;
      pvStack_38 = pvVar4;
      __move_median_to_first<sjtu::vector<sjtu::recordType>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<sjtu::cmp_cost>>
                (param_1,param_2,param_1 + 1,param_2,param_1 + (int)(uVar2 / 0x120),param_2,local_40
                 ,uVar1);
      __last = __unguarded_partition<sjtu::vector<sjtu::recordType>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<sjtu::cmp_cost>>
                         (param_1 + 1,param_2,prVar3,pvVar4,param_1,param_2);
      __introsort_loop<sjtu::vector<sjtu::recordType>::iterator,long,__gnu_cxx::__ops::_Iter_comp_iter<sjtu::cmp_cost>>
                (__last.pos,__last.vec,prVar3,pvVar4,__depth_limit);
      uVar2 = (long)__last.pos - (long)param_1;
      __depth_limit = __depth_limit + -1;
    } while (0x900 < (long)uVar2);
  }
  return;
}

Assistant:

typename std::iterator<std::random_access_iterator_tag, T>::difference_type operator-(const iterator &rhs) const {return pos - rhs.pos;}